

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__socket_sockopt(uv_handle_t *handle,int optname,int *value)

{
  int *piVar1;
  socklen_t local_34;
  uv_handle_type local_30;
  socklen_t len;
  int fd;
  int r;
  int *value_local;
  uv_handle_t *puStack_18;
  int optname_local;
  uv_handle_t *handle_local;
  
  if ((handle == (uv_handle_t *)0x0) || (value == (int *)0x0)) {
    handle_local._4_4_ = -0x16;
  }
  else {
    if ((handle->type == UV_TCP) || (handle->type == UV_NAMED_PIPE)) {
      local_30 = *(uv_handle_type *)&handle[2].close_cb;
    }
    else {
      if (handle->type != UV_UDP) {
        return -0x5f;
      }
      local_30 = handle[2].type;
    }
    local_34 = 4;
    _fd = value;
    value_local._4_4_ = optname;
    puStack_18 = handle;
    if (*value == 0) {
      len = getsockopt(local_30,1,optname,value,&local_34);
    }
    else {
      len = setsockopt(local_30,1,optname,value,4);
    }
    if ((int)len < 0) {
      piVar1 = __errno_location();
      handle_local._4_4_ = -*piVar1;
    }
    else {
      handle_local._4_4_ = 0;
    }
  }
  return handle_local._4_4_;
}

Assistant:

int uv__socket_sockopt(uv_handle_t* handle, int optname, int* value) {
  int r;
  int fd;
  socklen_t len;

  if (handle == NULL || value == NULL)
    return UV_EINVAL;

  if (handle->type == UV_TCP || handle->type == UV_NAMED_PIPE)
    fd = uv__stream_fd((uv_stream_t*) handle);
  else if (handle->type == UV_UDP)
    fd = ((uv_udp_t *) handle)->io_watcher.fd;
  else
    return UV_ENOTSUP;

  len = sizeof(*value);

  if (*value == 0)
    r = getsockopt(fd, SOL_SOCKET, optname, value, &len);
  else
    r = setsockopt(fd, SOL_SOCKET, optname, (const void*) value, len);

  if (r < 0)
    return UV__ERR(errno);

  return 0;
}